

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall File::readAll(File *this,String *data)

{
  usize uVar1;
  char *pcVar2;
  
  uVar1 = size(this);
  if (-1 < (long)uVar1) {
    String::resize(data,uVar1);
    pcVar2 = String::operator_cast_to_char_(data);
    uVar1 = read(this,(int)pcVar2,(void *)data->data->len,(size_t)data->data);
    if (-1 < (long)uVar1) {
      String::resize(data,uVar1);
      return true;
    }
    String::clear(data);
  }
  return false;
}

Assistant:

bool File::readAll(String& data)
{
  int64 fileSize = size();
  if(fileSize < 0)
    return false;
  data.resize((usize)fileSize);
  ssize dataCount = read((char*)data, data.length());
  if(dataCount < 0)
  {
    data.clear();
    return false;
  }
  data.resize(dataCount);
  return true;
}